

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O0

Result * CoreML::validatePositive(Result *__return_storage_ptr__,int value,string *name)

{
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string err;
  string *name_local;
  int value_local;
  Result *r;
  
  err.field_2._8_8_ = name;
  if (value < 1) {
    std::operator+(&local_80,name," must be positive, got ");
    std::__cxx11::to_string(&local_a0,value);
    std::operator+(&local_60,&local_80,&local_a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,".");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    Result::Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validatePositive(const int value, const std::string& name) {
    if (value <= 0 ) {
        std::string err = name + " must be positive, got " + std::to_string(value) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    Result r;
    return r;
}